

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

bool vkt::anon_unknown_0::logAndVerifyImages
               (TestLog *log,DeviceInterface *vk,VkDevice device,
               vector<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
               *attachmentResources,vector<bool,_std::allocator<bool>_> *attachmentIsLazy,
               RenderPass *renderPassInfo,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *renderPassClearValues,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *imageClearValues,
               vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
               *subpassRenderInfo,UVec2 *targetSize,TestConfig *config)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IVec3 *this;
  undefined8 uVar3;
  undefined8 uVar4;
  VkAttachmentLoadOp VVar5;
  VkFormat format_00;
  pointer pPVar6;
  pointer pPVar7;
  VkClearValue *value;
  DepthStencilClear *pDVar8;
  RenderQuad *pRVar9;
  undefined8 *puVar10;
  char *pcVar11;
  void *pvVar12;
  pointer pSVar13;
  void *data;
  byte bVar14;
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  VkClearValue VVar18;
  bool bVar19;
  bool bVar20;
  PixelValue PVar21;
  ushort uVar22;
  int iVar23;
  VkResult VVar24;
  pointer pvVar25;
  TextureFormat TVar26;
  pointer pPVar27;
  pointer pAVar28;
  pointer pAVar29;
  long *plVar30;
  TextureFormat *pTVar31;
  byte bVar32;
  undefined4 uVar33;
  uint uVar34;
  pointer pPVar35;
  ulong uVar36;
  pointer pAVar37;
  pointer pvVar38;
  long *plVar39;
  TextureFormat TVar40;
  size_type *psVar41;
  ConstPixelBufferAccess *pCVar42;
  ConstPixelBufferAccess *pCVar43;
  ushort uVar44;
  uint uVar45;
  pointer pSVar46;
  pointer pPVar47;
  pointer pSVar48;
  pointer pAVar49;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  pointer pSVar50;
  RenderPass *pRVar51;
  char cVar52;
  int compNdx;
  int iVar53;
  pointer pSVar54;
  PixelValue *pPVar55;
  int iVar56;
  uint uVar57;
  TextureLevel *pTVar58;
  int iVar59;
  ulong uVar60;
  long lVar61;
  PixelValue *pPVar62;
  pointer pCVar63;
  ulong uVar64;
  PixelValue *__cur;
  pointer pSVar65;
  ulong uVar66;
  ulong uVar67;
  long lVar68;
  ulong uVar69;
  DepthStencilClear *dsClear;
  long lVar70;
  bool bVar71;
  bool bVar72;
  uint uVar73;
  uint uVar74;
  float fVar75;
  int iVar76;
  float fVar78;
  int iVar79;
  undefined1 auVar77 [16];
  float fVar80;
  float fVar83;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar84;
  float fVar85;
  pointer local_518;
  string local_510;
  ulong local_4f0;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  RenderPass *local_4c8;
  pointer local_4c0;
  TextureLevel depthErrorImage;
  size_t index;
  undefined8 local_478;
  TextureLevel stencilErrorImage;
  string local_440;
  int local_420;
  uint local_41c;
  string local_418;
  undefined8 local_3f8;
  uint local_3ec;
  TextureFormat format;
  TextureFormat TStack_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _Alloc_hider local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8 [6];
  TextureFormat format_7;
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  referenceValues;
  TextureFormat format_3;
  anon_union_8_2_d0736028_for_Maybe<bool>_2 local_320;
  undefined8 local_318;
  undefined8 local_310;
  ulong local_308;
  undefined4 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  ulong local_2e0;
  ConstPixelBufferAccess depthAccess_1;
  long local_2b0;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  int local_280;
  int local_27c;
  ConstPixelBufferAccess stencilAccess_1;
  PixelBufferAccess depthAccess;
  ios_base local_1c8 [8];
  ios_base local_1c0 [264];
  int local_b8;
  int iStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  int local_a8;
  int iStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  long *local_98 [2];
  long local_88 [2];
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> referenceAttachments;
  TextureFormat stencilFormat;
  TextureFormat depthFormat;
  
  referenceValues.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  referenceValues.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  referenceValues.
  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  referenceAttachments.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  referenceAttachments.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  referenceAttachments.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this = &depthAccess.super_ConstPixelBufferAccess.m_size;
  depthAccess.super_ConstPixelBufferAccess.m_format = (TextureFormat)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"Reference images fill undefined pixels with 3x3 grid pattern.",0x3d);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&depthAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base(local_1c0);
  auVar15[0xf] = 0;
  auVar15._0_15_ = stack0xfffffffffffffc19;
  _format = (VkClearValue)(auVar15 << 8);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&depthAccess,
             (long)(renderPassInfo->m_attachments).
                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(renderPassInfo->m_attachments).
                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&format,
             (allocator_type *)&format_3);
  pAVar29 = (renderPassInfo->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar37 = (renderPassInfo->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_4c8 = renderPassInfo;
  if ((long)pAVar37 - (long)pAVar29 == 0) {
    pvVar25 = (pointer)0x0;
  }
  else {
    uVar69 = (long)pAVar37 - (long)pAVar29 >> 5;
    if (0x555555555555555 < uVar69) {
      std::__throw_length_error("vector::_M_default_append");
    }
    pvVar25 = (pointer)operator_new(uVar69 * 0x18);
    memset(pvVar25,0,uVar69 * 0x18);
    pAVar29 = (local_4c8->m_attachments).
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar37 = (local_4c8->m_attachments).
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    referenceValues.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar25 + uVar69;
    referenceValues.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         referenceValues.
         super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    referenceValues.
    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pvVar25;
  }
  pRVar51 = local_4c8;
  if (pAVar37 != pAVar29) {
    uVar69 = 0;
    do {
      TVar26 = ::vk::mapVkFormat(pAVar29[uVar69].m_format);
      format = TVar26;
      uVar66 = uVar69 * 3;
      pvVar38 = pvVar25 + uVar69;
      pSVar54 = (pointer)(ulong)(targetSize->m_data[1] * targetSize->m_data[0]);
      pPVar27 = (pvVar38->
                super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pPVar55 = (pvVar38->
                super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      lVar61 = (long)pPVar55 - (long)pPVar27;
      pSVar50 = (pointer)(lVar61 >> 1);
      lVar70 = (long)pSVar50 - (long)pSVar54;
      if (pSVar54 <= pSVar50) {
        if ((pSVar54 <= pSVar50 && lVar70 != 0) &&
           (pPVar62 = pPVar27 + (long)pSVar54, pPVar55 != pPVar62)) {
          (pvVar38->
          super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
          )._M_impl.super__Vector_impl_data._M_finish = pPVar62;
        }
      }
      else {
        pSVar46 = (pointer)((long)pSVar54 - (long)pSVar50);
        if (pSVar46 != (pointer)0x0) {
          local_4f0 = uVar66;
          if ((pointer)((long)(pvVar38->
                              super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar55 >>
                       1) < pSVar46) {
            if ((pointer)((ulong)pSVar50 ^ 0x3fffffffffffffff) < pSVar46) {
              std::__throw_length_error("vector::_M_default_append");
            }
            pSVar65 = pSVar46;
            if (pSVar46 < pSVar50) {
              pSVar65 = pSVar50;
            }
            lVar70 = (long)(pSVar65->m_viewportOffset).m_data + (long)pSVar50;
            local_4c0 = pSVar46;
            pPVar27 = (pointer)operator_new(lVar70 * 2);
            pPVar62 = (PixelValue *)(lVar61 + (long)pPVar27);
            lVar61 = (long)pSVar50 - (long)pSVar54;
            pPVar55 = pPVar62;
            do {
              PixelValue::PixelValue
                        (pPVar55,(Maybe<bool> *)0x0,(Maybe<bool> *)0x0,(Maybe<bool> *)0x0,
                         (Maybe<bool> *)0x0);
              pPVar55 = pPVar55 + 1;
              lVar61 = lVar61 + 1;
            } while (lVar61 != 0);
            pPVar7 = (pvVar38->
                     super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pPVar6 = (pvVar38->
                     super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pPVar35 = pPVar27;
            for (pPVar47 = pPVar6; pPVar47 != pPVar7; pPVar47 = pPVar47 + 1) {
              pPVar35->m_status = pPVar47->m_status;
              pPVar35 = pPVar35 + 1;
            }
            if (pPVar6 != (pointer)0x0) {
              operator_delete(pPVar6,(long)(pvVar38->
                                           super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                           )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pPVar6);
            }
            (pvVar38->
            super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
            )._M_impl.super__Vector_impl_data._M_start = pPVar27;
            (pvVar38->
            super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
            )._M_impl.super__Vector_impl_data._M_finish = pPVar62 + (long)local_4c0;
            (pvVar38->
            super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar27 + lVar70;
            uVar66 = local_4f0;
          }
          else {
            do {
              PixelValue::PixelValue
                        (pPVar55,(Maybe<bool> *)0x0,(Maybe<bool> *)0x0,(Maybe<bool> *)0x0,
                         (Maybe<bool> *)0x0);
              pPVar55 = pPVar55 + 1;
              lVar70 = lVar70 + 1;
            } while (lVar70 != 0);
            (pvVar38->
            super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
            )._M_impl.super__Vector_impl_data._M_finish = pPVar55;
            uVar66 = local_4f0;
          }
        }
      }
      pRVar51 = local_4c8;
      value = (&((imageClearValues->
                 super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->m_ptr)[uVar66];
      if (value != (VkClearValue *)0x0) {
        format_3.order = 0x1010101;
        PVar21 = clearValueToPixelValue(value,&format);
        depthAccess_1.m_format.order = CONCAT22(depthAccess_1.m_format.order._2_2_,PVar21.m_status);
        clearReferenceValues
                  ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)(pvVar38->
                      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                   (UVec2 *)(ulong)targetSize->m_data[0],(UVec2 *)0x0,(UVec2 *)0x0,
                   (BVec4 *)(ulong)targetSize->m_data[0],(PixelValue *)(ulong)targetSize->m_data[1])
        ;
      }
      uVar69 = uVar69 + 1;
      pAVar29 = (pRVar51->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar37 = (pRVar51->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar69 < (ulong)((long)pAVar37 - (long)pAVar29 >> 5));
  }
  pSVar48 = (pRVar51->m_subpasses).
            super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pRVar51->m_subpasses).
      super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar48) {
    uVar69 = 0;
    do {
      local_4c0 = (subpassRenderInfo->
                  super__Vector_base<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar69;
      local_478 = pSVar48 + uVar69;
      pAVar28 = pSVar48[uVar69].m_colorAttachments.
                super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar49 = pSVar48[uVar69].m_colorAttachments.
                super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pAVar49 != pAVar28) {
        pvVar25 = referenceValues.
                  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar66 = 0;
        TVar26 = depthAccess.super_ConstPixelBufferAccess.m_format;
        do {
          uVar73 = pAVar28[uVar66].m_attachment;
          uVar67 = (ulong)uVar73;
          if ((*(ulong *)((long)TVar26 + (ulong)(uVar73 >> 6) * 8) >> (uVar67 & 0x3f) & 1) == 0) {
            pAVar29 = (pRVar51->m_attachments).
                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            TVar26 = ::vk::mapVkFormat(pAVar29[uVar67].m_format);
            format = TVar26;
            VVar5 = pAVar29[uVar67].m_loadOp;
            if (VVar5 == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
              format_3.order = 0x1010101;
              markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)pvVar25[uVar67].
                               super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                               ._M_impl.super__Vector_impl_data._M_start,(BVec4 *)&format_3,
                            (UVec2 *)(ulong)targetSize->m_data[0],
                            (UVec2 *)(ulong)(config->renderPos).m_data[0],
                            (UVec2 *)(ulong)(config->renderPos).m_data[1]);
            }
            else if (VVar5 == VK_ATTACHMENT_LOAD_OP_CLEAR) {
              format_3.order = 0x1010101;
              PVar21 = clearValueToPixelValue
                                 ((renderPassClearValues->
                                  super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar67].m_ptr,&format);
              depthAccess_1.m_format.order =
                   CONCAT22(depthAccess_1.m_format.order._2_2_,PVar21.m_status);
              clearReferenceValues
                        ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          *)pvVar25[uVar67].
                            super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                         (UVec2 *)(ulong)targetSize->m_data[0],
                         (UVec2 *)(ulong)(config->renderPos).m_data[0],
                         (UVec2 *)(ulong)(config->renderPos).m_data[1],
                         (BVec4 *)(ulong)(config->renderSize).m_data[0],
                         (PixelValue *)(ulong)(config->renderSize).m_data[1]);
            }
            puVar1 = (ulong *)((long)depthAccess.super_ConstPixelBufferAccess.m_format +
                              (ulong)(uVar73 >> 6) * 8);
            *puVar1 = *puVar1 | 1L << ((byte)uVar73 & 0x3f);
            pAVar28 = (local_478->m_colorAttachments).
                      super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pAVar49 = (local_478->m_colorAttachments).
                      super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pRVar51 = local_4c8;
            TVar26 = depthAccess.super_ConstPixelBufferAccess.m_format;
          }
          uVar66 = uVar66 + 1;
        } while (uVar66 < (ulong)((long)pAVar49 - (long)pAVar28 >> 3));
      }
      uVar73 = (local_478->m_depthStencilAttachment).m_attachment;
      uVar66 = (ulong)uVar73;
      if (uVar66 != 0xffffffff) {
        if ((*(ulong *)((long)depthAccess.super_ConstPixelBufferAccess.m_format +
                       (ulong)(uVar73 >> 6) * 8) >> (uVar66 & 0x3f) & 1) == 0) {
          pAVar29 = (pRVar51->m_attachments).
                    super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar25 = referenceValues.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar66;
          TVar26 = ::vk::mapVkFormat(pAVar29[uVar66].m_format);
          format = TVar26;
          bVar19 = tcu::hasDepthComponent(TVar26.order);
          if (bVar19) {
            if (pAVar29[uVar66].m_loadOp == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
              format_3.order = A;
              markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)(pvVar25->
                               super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                               )._M_impl.super__Vector_impl_data._M_start,(BVec4 *)&format_3,
                            (UVec2 *)(ulong)targetSize->m_data[0],
                            (UVec2 *)(ulong)(config->renderPos).m_data[0],
                            (UVec2 *)(ulong)(config->renderPos).m_data[1]);
            }
            else if (pAVar29[uVar66].m_loadOp == VK_ATTACHMENT_LOAD_OP_CLEAR) {
              format_3.order = A;
              PVar21 = clearValueToPixelValue
                                 ((renderPassClearValues->
                                  super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar66].m_ptr,&format);
              depthAccess_1.m_format.order =
                   CONCAT22(depthAccess_1.m_format.order._2_2_,PVar21.m_status);
              clearReferenceValues
                        ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          *)(pvVar25->
                            super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                         (UVec2 *)(ulong)targetSize->m_data[0],
                         (UVec2 *)(ulong)(config->renderPos).m_data[0],
                         (UVec2 *)(ulong)(config->renderPos).m_data[1],
                         (BVec4 *)(ulong)(config->renderSize).m_data[0],
                         (PixelValue *)(ulong)(config->renderSize).m_data[1]);
            }
          }
          bVar19 = tcu::hasStencilComponent(format.order);
          if (bVar19) {
            if (pAVar29[uVar66].m_stencilLoadOp == VK_ATTACHMENT_LOAD_OP_DONT_CARE) {
              format_3.order = 0x100;
              markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                             *)(pvVar25->
                               super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                               )._M_impl.super__Vector_impl_data._M_start,(BVec4 *)&format_3,
                            (UVec2 *)(ulong)targetSize->m_data[0],
                            (UVec2 *)(ulong)(config->renderPos).m_data[0],
                            (UVec2 *)(ulong)(config->renderPos).m_data[1]);
            }
            else if (pAVar29[uVar66].m_stencilLoadOp == VK_ATTACHMENT_LOAD_OP_CLEAR) {
              format_3.order = 0x100;
              PVar21 = clearValueToPixelValue
                                 ((renderPassClearValues->
                                  super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar66].m_ptr,&format);
              depthAccess_1.m_format.order =
                   CONCAT22(depthAccess_1.m_format.order._2_2_,PVar21.m_status);
              clearReferenceValues
                        ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                          *)(pvVar25->
                            super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                         (UVec2 *)(ulong)targetSize->m_data[0],
                         (UVec2 *)(ulong)(config->renderPos).m_data[0],
                         (UVec2 *)(ulong)(config->renderPos).m_data[1],
                         (BVec4 *)(ulong)(config->renderSize).m_data[0],
                         (PixelValue *)(ulong)(config->renderSize).m_data[1]);
            }
          }
          puVar1 = (ulong *)((long)depthAccess.super_ConstPixelBufferAccess.m_format +
                            (ulong)(uVar73 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar73 & 0x3f);
        }
      }
      pCVar63 = (local_4c0->m_colorClears).
                super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((local_4c0->m_colorClears).
          super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
          ._M_impl.super__Vector_impl_data._M_finish != pCVar63) {
        lVar61 = 0x10;
        local_3f8 = referenceValues.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        uVar66 = 0;
        do {
          uVar73 = *(uint *)((long)(&pCVar63->m_offset + -2) + lVar61);
          uVar74 = *(uint *)((long)(pCVar63->m_offset).m_data + lVar61 + -0xc);
          uVar34 = *(uint *)((long)(&pCVar63->m_offset + -1) + lVar61);
          local_4f0 = CONCAT44(local_4f0._4_4_,
                               *(undefined4 *)((long)(pCVar63->m_offset).m_data + lVar61 + -4));
          uVar45 = (local_478->m_colorAttachments).
                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar66].m_attachment;
          format_3 = ::vk::mapVkFormat((local_4c8->m_attachments).
                                       super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar45].m_format);
          _format = *(VkClearValue *)((long)(pCVar63->m_offset).m_data + lVar61);
          depthAccess_1.m_format.order = 0x1010101;
          stencilAccess_1.m_format.order._0_2_ =
               clearValueToPixelValue((VkClearValue *)&format,&format_3);
          clearReferenceValues
                    ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                      *)local_3f8[uVar45].
                        super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                     (UVec2 *)(ulong)targetSize->m_data[0],(UVec2 *)(ulong)uVar73,
                     (UVec2 *)(ulong)uVar74,(BVec4 *)(ulong)uVar34,
                     (PixelValue *)(local_4f0 & 0xffffffff));
          uVar66 = uVar66 + 1;
          pCVar63 = (local_4c0->m_colorClears).
                    super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar61 = lVar61 + 0x20;
        } while (uVar66 < (ulong)((long)(local_4c0->m_colorClears).
                                        super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar63
                                 >> 5));
      }
      pDVar8 = (local_4c0->m_depthStencilClear).m_ptr;
      if (pDVar8 != (DepthStencilClear *)0x0) {
        uVar73 = (pDVar8->m_offset).m_data[0];
        uVar74 = (pDVar8->m_offset).m_data[1];
        uVar34 = (pDVar8->m_size).m_data[0];
        uVar45 = (pDVar8->m_size).m_data[1];
        uVar57 = (local_478->m_depthStencilAttachment).m_attachment;
        format_3 = ::vk::mapVkFormat((local_4c8->m_attachments).
                                     super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar57].m_format);
        bVar19 = tcu::hasStencilComponent(format_3.order);
        local_4f0 = CONCAT44(local_4f0._4_4_,uVar45);
        bVar20 = tcu::hasDepthComponent(format_3.order);
        VVar18 = _format;
        pvVar25 = referenceValues.
                  super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = pDVar8->m_depth;
        uVar17 = pDVar8->m_stencil;
        format.type = uVar17;
        format.order = uVar16;
        TStack_3e0 = VVar18._8_8_;
        depthAccess_1.m_format.order = (ChannelOrder)CONCAT11(bVar19,bVar20);
        stencilAccess_1.m_format.order._0_2_ =
             clearValueToPixelValue((VkClearValue *)&format,&format_3);
        clearReferenceValues
                  ((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                    *)pvVar25[uVar57].
                      super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                   (UVec2 *)(ulong)targetSize->m_data[0],(UVec2 *)(ulong)uVar73,
                   (UVec2 *)(ulong)uVar74,(BVec4 *)(ulong)uVar34,
                   (PixelValue *)(local_4f0 & 0xffffffff));
      }
      pRVar51 = local_4c8;
      pRVar9 = (local_4c0->m_renderQuad).m_ptr;
      if (pRVar9 != (RenderQuad *)0x0) {
        puVar10 = *(undefined8 **)
                   &(pRVar9->m_vertices).
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
        ;
        uVar3 = *puVar10;
        uVar66 = *(ulong *)(local_4c0->m_viewportOffset).m_data;
        auVar81._0_8_ = uVar66 & 0xffffffff;
        auVar81._8_4_ = (int)(uVar66 >> 0x20);
        auVar81._12_4_ = 0;
        uVar4 = puVar10[2];
        uVar66 = *(ulong *)(local_4c0->m_viewportSize).m_data;
        auVar82._0_8_ = uVar66 & 0xffffffff;
        auVar82._8_4_ = (int)(uVar66 >> 0x20);
        auVar82._12_4_ = 0;
        fVar80 = (float)(SUB168(auVar82 | _DAT_00a992e0,0) - (double)DAT_00a992e0) * 0.5;
        fVar83 = (float)(SUB168(auVar82 | _DAT_00a992e0,8) - DAT_00a992e0._8_8_) * 0.5;
        fVar84 = (float)(SUB168(auVar81 | _DAT_00a992e0,0) - (double)DAT_00a992e0) + fVar80;
        fVar85 = (float)(SUB168(auVar81 | _DAT_00a992e0,8) - DAT_00a992e0._8_8_) + fVar83;
        fVar75 = (float)uVar3 * fVar80 + fVar84;
        fVar78 = (float)((ulong)uVar3 >> 0x20) * fVar83 + fVar85;
        uVar73 = -(uint)(fVar75 < 0.0);
        uVar74 = -(uint)(fVar78 < 0.0);
        iVar76 = (int)((float)(~uVar73 & 0x3f000000 | uVar73 & 0xbf000000) + fVar75);
        iVar79 = (int)((float)(~uVar74 & 0x3f000000 | uVar74 & 0xbf000000) + fVar78);
        uStack_a0 = 0;
        uStack_9c = 0;
        fVar84 = fVar80 * (float)uVar4 + fVar84;
        fVar85 = fVar83 * (float)((ulong)uVar4 >> 0x20) + fVar85;
        uVar73 = -(uint)(fVar84 < 0.0);
        uVar74 = -(uint)(fVar85 < 0.0);
        local_b8 = (int)((float)(~uVar73 & 0x3f000000 | uVar73 & 0xbf000000) + fVar84);
        iStack_b4 = (int)((float)(~uVar74 & 0x3f000000 | uVar74 & 0xbf000000) + fVar85);
        uStack_b0 = 0;
        uStack_ac = 0;
        iVar59 = (int)uVar69;
        local_a8 = iVar76;
        iStack_a4 = iVar79;
        if ((local_478->m_inputAttachments).
            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (local_478->m_inputAttachments).
            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pAVar28 = (local_478->m_colorAttachments).
                    super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((local_478->m_colorAttachments).
              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
              ._M_impl.super__Vector_impl_data._M_finish != pAVar28) {
            auVar77._0_4_ = -(uint)(iVar76 < local_b8);
            auVar77._4_4_ = auVar77._0_4_;
            auVar77._8_4_ = -(uint)(iVar79 < iStack_b4);
            auVar77._12_4_ = -(uint)(iVar79 < iStack_b4);
            uVar33 = movmskpd((int)local_478,auVar77);
            local_4c0 = (pointer)CONCAT44(local_4c0._4_4_,uVar33);
            local_3ec = CONCAT31(local_3ec._1_3_,(byte)uVar33 >> 1);
            pvVar25 = referenceValues.
                      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_3f8 = (pointer)CONCAT44(local_3f8._4_4_,iStack_b4);
            local_4f0 = CONCAT44(local_4f0._4_4_,local_b8);
            uVar66 = 0;
            do {
              uVar67 = (ulong)pAVar28[uVar66].m_attachment;
              TVar26 = ::vk::mapVkFormat((pRVar51->m_attachments).
                                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar67].m_format)
              ;
              format = TVar26;
              tcu::getTextureFormatChannelMask((tcu *)&format_3,&format);
              if ((char)local_3ec != '\0') {
                iVar23 = iVar79;
                do {
                  if (((ulong)local_4c0 & 1) != 0) {
                    uVar73 = iVar23 % 2;
                    iVar53 = iVar76;
                    do {
                      uVar74 = iVar53 % 2;
                      uVar34 = targetSize->m_data[0] * iVar23 + iVar53;
                      pTVar31 = &format_3;
                      lVar61 = 0;
                      cVar52 = '\0';
                      uVar60 = uVar67 + uVar69;
                      do {
                        if ((char)pTVar31->order == A) {
                          pPVar27 = pvVar25[uVar67].
                                    super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          bVar32 = (byte)lVar61;
                          if (3 < *(uint *)(&DAT_00a99480 + (ulong)((uint)uVar60 & 3) * 4)) {
                            bVar14 = bVar32 & 0x1f;
                            bVar32 = cVar52 * '\x02';
                            uVar22 = (ushort)(1 << bVar14) | pPVar27[uVar34].m_status;
                            goto LAB_003a6f8f;
                          }
                          uVar57 = (uint)(uVar60 >> 1) & 1;
                          uVar45 = (uint)uVar60 & 1;
                          switch(*(uint *)(&DAT_00a99480 + (ulong)((uint)uVar60 & 3) * 4)) {
                          case 0:
                            uVar22 = (ushort)(1 << (bVar32 & 0x1f)) | pPVar27[uVar34].m_status;
                            if (uVar74 == uVar45) {
joined_r0x003a6f66:
                              if (uVar73 == uVar57) goto LAB_003a6f68;
                            }
                            break;
                          case 1:
                            bVar14 = bVar32 & 0x1f;
                            bVar32 = cVar52 * '\x02';
                            uVar22 = (ushort)(1 << bVar14) | pPVar27[uVar34].m_status;
                            if (uVar74 != uVar45) goto joined_r0x003a6f66;
LAB_003a6f68:
                            uVar22 = uVar22 | (ushort)(2 << (bVar32 & 0x1f));
                            goto LAB_003a6f9e;
                          case 2:
                            bVar14 = bVar32 & 0x1f;
                            bVar32 = cVar52 * '\x02';
                            uVar22 = (ushort)(1 << bVar14) | pPVar27[uVar34].m_status;
                            if ((uVar73 == uVar57) == (uVar74 == uVar45)) goto LAB_003a6f68;
                            break;
                          case 3:
                            bVar14 = bVar32 & 0x1f;
                            bVar32 = cVar52 * '\x02';
                            uVar22 = (ushort)(1 << bVar14) | pPVar27[uVar34].m_status;
                            if ((uVar73 == uVar57) != (uVar74 == uVar45)) goto LAB_003a6f68;
                          }
LAB_003a6f8f:
                          uVar22 = uVar22 & ~(ushort)(2 << (bVar32 & 0x1e));
LAB_003a6f9e:
                          pPVar27[uVar34].m_status = uVar22;
                          pRVar51 = local_4c8;
                        }
                        cVar52 = cVar52 + '\x01';
                        uVar60 = uVar60 + 1;
                        lVar61 = lVar61 + 2;
                        pTVar31 = (TextureFormat *)((long)&pTVar31->order + 1);
                      } while (lVar61 != 8);
                      iVar53 = iVar53 + 1;
                    } while (iVar53 != (int)local_4f0);
                  }
                  iVar23 = iVar23 + 1;
                } while (iVar23 != (int)local_3f8);
              }
              uVar66 = uVar66 + 1;
              pAVar28 = (local_478->m_colorAttachments).
                        super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar66 < (ulong)((long)(local_478->m_colorAttachments).
                                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pAVar28 >> 3));
          }
          uVar66 = (ulong)(local_478->m_depthStencilAttachment).m_attachment;
          if ((uVar66 != 0xffffffff) &&
             (TVar26 = ::vk::mapVkFormat((local_4c8->m_attachments).
                                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar66].m_format)
             , iVar23 = local_a8, iVar79 = iStack_b4, iVar76 = local_b8, iStack_a4 < iStack_b4)) {
            pvVar25 = referenceValues.
                      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar66;
            uVar73 = iVar59 + 1;
            local_3f8 = (pointer)(CONCAT44(local_3f8._4_4_,uVar73) & 0xffffffff00000001);
            local_4c0 = (pointer)(ulong)(uVar73 >> 1 & 1);
            iVar59 = iStack_a4;
            do {
              if (iVar23 < iVar76) {
                local_4f0 = CONCAT44(local_4f0._4_4_,iVar59 % 2);
                iVar53 = iVar23;
                do {
                  bVar19 = tcu::hasDepthComponent(TVar26.order);
                  if (bVar19) {
                    uVar74 = targetSize->m_data[0] * iVar59 + iVar53;
                    pPVar27 = (pvVar25->
                              super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    if (3 < *(uint *)(&DAT_00a99480 + (ulong)(uVar73 & 3) * 4)) {
                      uVar22 = pPVar27[uVar74].m_status | 1;
                      goto LAB_003a71d1;
                    }
                    iVar56 = iVar53 % 2;
                    switch(*(uint *)(&DAT_00a99480 + (ulong)(uVar73 & 3) * 4)) {
                    case 0:
                      uVar22 = pPVar27[uVar74].m_status | 1;
                      if ((int)local_4f0 == (int)local_4c0) {
LAB_003a71bc:
                        if (iVar56 == (int)local_3f8) goto LAB_003a71c5;
                      }
                      break;
                    case 1:
                      uVar22 = pPVar27[uVar74].m_status | 1;
                      if ((int)local_4f0 != (int)local_4c0) goto LAB_003a71bc;
LAB_003a71c5:
                      uVar22 = uVar22 | 2;
                      goto LAB_003a71d7;
                    case 2:
                      uVar22 = pPVar27[uVar74].m_status | 1;
                      if (((int)local_4f0 == (int)local_4c0) == (iVar56 == (int)local_3f8))
                      goto LAB_003a71c5;
                      break;
                    case 3:
                      uVar22 = pPVar27[uVar74].m_status | 1;
                      if (((int)local_4f0 == (int)local_4c0) != (iVar56 == (int)local_3f8))
                      goto LAB_003a71c5;
                    }
LAB_003a71d1:
                    uVar22 = uVar22 & 0xfffd;
LAB_003a71d7:
                    pPVar27[uVar74].m_status = uVar22;
                  }
                  bVar19 = tcu::hasStencilComponent(TVar26.order);
                  if (bVar19) {
                    uVar74 = targetSize->m_data[0] * iVar59 + iVar53;
                    pPVar27 = (pvVar25->
                              super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    uVar22 = pPVar27[uVar74].m_status;
                    uVar44 = uVar22 | 0xc;
                    if ((uVar69 & 1) != 0) {
                      uVar44 = uVar22 & 0xfff3 | 4;
                    }
                    pPVar27[uVar74].m_status = uVar44;
                  }
                  iVar53 = iVar53 + 1;
                } while (iVar76 != iVar53);
              }
              iVar59 = iVar59 + 1;
            } while (iVar59 != iVar79);
          }
        }
        else {
          _format = (VkClearValue)ZEXT816(0);
          local_3d8._M_allocated_capacity = 0;
          pAVar28 = (local_478->m_colorAttachments).
                    super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((local_478->m_colorAttachments).
              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
              ._M_impl.super__Vector_impl_data._M_finish == pAVar28) {
            local_2b0 = 0;
          }
          else {
            local_2b0 = 0;
            uVar66 = 0;
            do {
              TVar26 = ::vk::mapVkFormat((pRVar51->m_attachments).
                                         super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [pAVar28[uVar66].m_attachment].m_format);
              iVar76 = tcu::getNumUsedChannels(TVar26.order);
              local_2b0 = local_2b0 + iVar76;
              uVar66 = uVar66 + 1;
              pAVar28 = (local_478->m_colorAttachments).
                        super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar66 < (ulong)((long)(local_478->m_colorAttachments).
                                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pAVar28 >> 3));
          }
          iVar76 = iStack_b4;
          uVar73 = (local_478->m_depthStencilAttachment).m_attachment;
          local_420 = iStack_a4;
          if (iStack_a4 < iStack_b4) {
            uVar66 = local_2b0 + (ulong)(uVar73 != 0xffffffff);
            local_280 = local_a8;
            local_27c = local_b8;
            pvVar25 = referenceValues.
                      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_4f0 = CONCAT44(local_4f0._4_4_,iStack_a4);
            pSVar48 = local_478;
            do {
              if (local_280 < local_27c) {
                local_41c = (int)local_4f0 % 2;
                iVar79 = local_280;
                do {
                  pAVar28 = (pSVar48->m_inputAttachments).
                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((pSVar48->m_inputAttachments).
                      super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pAVar28) {
                    uVar67 = 0;
                    do {
                      uVar73 = pAVar28[uVar67].m_attachment;
                      TVar26 = ::vk::mapVkFormat((local_4c8->m_attachments).
                                                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar73].
                                                 m_format);
                      iVar23 = tcu::getNumUsedChannels(TVar26.order);
                      if (0 < iVar23) {
                        uVar74 = 0;
                        do {
                          uVar22 = pvVar25[uVar73].
                                   super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [targetSize->m_data[0] * (int)local_4f0 + iVar79].m_status;
                          if ((uVar22 >> (uVar74 & 0x1e) & 1) == 0) {
                            format_3.order = R;
                            format_3.type = SNORM_INT8;
                          }
                          else {
                            local_320.m_data[0] =
                                 (deUint8  [1])
                                 (deUint8  [1])(char)((uVar22 >> ((byte)uVar74 & 0x1f) & 2) >> 1);
                            format_3 = (TextureFormat)&local_320;
                          }
                          std::vector<tcu::Maybe<bool>,std::allocator<tcu::Maybe<bool>>>::
                          emplace_back<tcu::Maybe<bool>>
                                    ((vector<tcu::Maybe<bool>,std::allocator<tcu::Maybe<bool>>> *)
                                     &format,(Maybe<bool> *)&format_3);
                          uVar74 = uVar74 + 2;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      uVar67 = uVar67 + 1;
                      pAVar28 = (local_478->m_inputAttachments).
                                super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    } while (uVar67 < (ulong)((long)(local_478->m_inputAttachments).
                                                                                                        
                                                  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)pAVar28 >> 3));
                  }
                  uVar67 = (long)TStack_3e0 - (long)format >> 4;
                  lVar61 = 1;
                  if (uVar66 <= uVar67) {
                    lVar61 = (uVar67 / uVar66 + 1) - (ulong)(uVar67 % uVar66 == 0);
                  }
                  pAVar28 = (local_478->m_colorAttachments).
                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((local_478->m_colorAttachments).
                      super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                      ._M_impl.super__Vector_impl_data._M_finish == pAVar28) {
                    lVar70 = 0;
                  }
                  else {
                    lVar70 = 0;
                    uVar67 = 0;
                    do {
                      uVar73 = pAVar28[uVar67].m_attachment;
                      TVar26 = ::vk::mapVkFormat((local_4c8->m_attachments).
                                                 super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar73].
                                                 m_format);
                      local_3ec = tcu::getNumUsedChannels(TVar26.order);
                      if (0 < (int)local_3ec) {
                        uVar74 = uVar73 + iVar59 + (int)lVar70;
                        bVar20 = iVar79 % 2 == (uVar74 & 1);
                        bVar71 = local_41c == ((uVar74 >> 1 & 1) != 0);
                        uVar33 = *(undefined4 *)(&DAT_00a99480 + (ulong)(uVar74 & 3) * 4);
                        bVar19 = bVar20 != bVar71;
                        local_4c0 = (pointer)CONCAT71(local_4c0._1_7_,bVar19);
                        local_3f8 = (pointer)CONCAT71(local_3f8._1_7_,!bVar19);
                        uVar74 = targetSize->m_data[0] * (int)local_4f0 + iVar79;
                        uVar64 = lVar61 * lVar70;
                        uVar60 = 0;
                        do {
                          switch(uVar33) {
                          case 0:
                            bVar72 = bVar20 && bVar71;
                            break;
                          case 1:
                            bVar72 = bVar20 || bVar71;
                            break;
                          case 2:
                            bVar72 = !bVar19;
                            break;
                          case 3:
                            bVar72 = bVar19;
                            break;
                          default:
                            bVar72 = false;
                          }
                          local_320.m_data[0] = (deUint8  [1])(deUint8  [1])bVar72;
                          if (lVar61 != 0) {
                            uVar36 = uVar64;
                            lVar68 = lVar61;
                            do {
                              pcVar11 = *(char **)((long)format +
                                                  (uVar36 % (ulong)((long)TStack_3e0 - (long)format
                                                                   >> 4)) * 0x10);
                              if (pcVar11 == (char *)0x0) {
                                format_3.order = R;
                                format_3.type = SNORM_INT8;
                                bVar32 = (char)uVar60 * '\x02' & 0x1f;
                                pPVar27 = pvVar25[uVar73].
                                          super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar74;
                                pPVar27->m_status =
                                     pPVar27->m_status &
                                     ((ushort)(-2 << bVar32) | (ushort)(0xfffffffe >> 0x20 - bVar32)
                                     );
                                goto LAB_003a7634;
                              }
                              bVar72 = bVar72 == (bool)*pcVar11;
                              local_320.m_data[0] = (deUint8  [1])(deUint8  [1])bVar72;
                              uVar36 = uVar36 + 1;
                              lVar68 = lVar68 + -1;
                            } while (lVar68 != 0);
                          }
                          format_3 = (TextureFormat)&local_320;
                          bVar32 = (char)uVar60 * '\x02';
                          pPVar27 = pvVar25[uVar73].
                                    super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          uVar22 = (ushort)(1 << (bVar32 & 0x1f)) | pPVar27[uVar74].m_status;
                          if (bVar72 == false) {
                            uVar22 = uVar22 & ~(ushort)(2 << (bVar32 & 0x1e));
                          }
                          else {
                            uVar22 = uVar22 | (ushort)(2 << (bVar32 & 0x1f));
                          }
                          pPVar27[uVar74].m_status = uVar22;
LAB_003a7634:
                          uVar60 = uVar60 + 1;
                          uVar64 = uVar64 + lVar61;
                        } while (uVar60 != local_3ec);
                      }
                      lVar70 = lVar70 + (int)local_3ec;
                      uVar67 = uVar67 + 1;
                      pAVar28 = (local_478->m_colorAttachments).
                                super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    } while (uVar67 < (ulong)((long)(local_478->m_colorAttachments).
                                                                                                        
                                                  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)pAVar28 >> 3));
                  }
                  uVar73 = (local_478->m_depthStencilAttachment).m_attachment;
                  if ((ulong)uVar73 != 0xffffffff) {
                    uVar74 = iVar59 + uVar73;
                    if (*(uint *)(&DAT_00a99480 + (ulong)(uVar74 & 3) * 4) < 4) {
                      uVar45 = iVar79 % 2;
                      uVar57 = uVar74 & 1;
                      uVar34 = uVar74 >> 1 & 1;
                      switch(*(uint *)(&DAT_00a99480 + (ulong)(uVar74 & 3) * 4)) {
                      case 0:
                        bVar19 = uVar45 == uVar57 && uVar34 == local_41c;
                        break;
                      case 1:
                        bVar19 = uVar45 == uVar57 || local_41c == uVar34;
                        break;
                      case 2:
                        bVar19 = (uVar45 == uVar57) == (local_41c == uVar34);
                        break;
                      case 3:
                        bVar19 = (uVar45 == uVar57) != (local_41c == uVar34);
                      }
                    }
                    else {
                      bVar19 = false;
                    }
                    local_320.m_data[0] = (deUint8  [1])(deUint8  [1])bVar19;
                    if (lVar61 != 0) {
                      uVar67 = lVar70 * lVar61;
                      do {
                        pcVar11 = *(char **)((long)format +
                                            (uVar67 % (ulong)((long)TStack_3e0 - (long)format >> 4))
                                            * 0x10);
                        if (pcVar11 == (char *)0x0) {
                          format_3.order = R;
                          format_3.type = SNORM_INT8;
                          pPVar27 = pvVar25[uVar73].
                                    super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                                    (targetSize->m_data[0] * (int)local_4f0 + iVar79);
                          pPVar27->m_status = pPVar27->m_status & 0xfffe;
                          goto LAB_003a7819;
                        }
                        bVar19 = bVar19 == (bool)*pcVar11;
                        local_320.m_data[0] = (deUint8  [1])(deUint8  [1])bVar19;
                        uVar67 = uVar67 + 1;
                        lVar61 = lVar61 + -1;
                      } while (lVar61 != 0);
                    }
                    format_3 = (TextureFormat)&local_320;
                    uVar74 = targetSize->m_data[0] * (int)local_4f0 + iVar79;
                    pPVar27 = pvVar25[uVar73].
                              super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar22 = pPVar27[uVar74].m_status;
                    uVar44 = uVar22 | 3;
                    if (bVar19 == false) {
                      uVar44 = (uVar22 & 0xfffc) + 1;
                    }
                    pPVar27[uVar74].m_status = uVar44;
                  }
LAB_003a7819:
                  if (TStack_3e0 != format) {
                    TStack_3e0.order = format.order;
                    TStack_3e0.type = format.type;
                  }
                  iVar79 = iVar79 + 1;
                  pSVar48 = local_478;
                } while (iVar79 != local_27c);
              }
              iVar79 = (int)local_4f0 + 1;
              local_4f0 = CONCAT44(local_4f0._4_4_,iVar79);
            } while (iVar79 != iVar76);
            uVar73 = (pSVar48->m_depthStencilAttachment).m_attachment;
          }
          if (uVar73 != 0xffffffff) {
            TVar26 = ::vk::mapVkFormat((local_4c8->m_attachments).
                                       super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar73].m_format);
            pvVar25 = referenceValues.
                      super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar73;
            bVar19 = tcu::hasStencilComponent(TVar26.order);
            if (bVar19 && local_420 < iVar76) {
              uVar73 = targetSize->m_data[0];
              uVar74 = local_420 * uVar73 + local_a8;
              do {
                if (local_a8 < local_b8) {
                  pPVar27 = (pvVar25->
                            super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  iVar59 = local_b8 - local_a8;
                  uVar34 = uVar74;
                  do {
                    uVar22 = pPVar27[uVar34].m_status;
                    uVar44 = uVar22 | 0xc;
                    if ((uVar69 & 1) != 0) {
                      uVar44 = uVar22 & 0xfff3 | 4;
                    }
                    pPVar27[uVar34].m_status = uVar44;
                    uVar34 = uVar34 + 1;
                    iVar59 = iVar59 + -1;
                  } while (iVar59 != 0);
                }
                local_420 = local_420 + 1;
                uVar74 = uVar74 + uVar73;
              } while (local_420 != iVar76);
            }
          }
          if (format != (TextureFormat)0x0) {
            operator_delete((void *)format,local_3d8._M_allocated_capacity - (long)format);
          }
        }
      }
      uVar69 = uVar69 + 1;
      pSVar48 = (local_4c8->m_subpasses).
                super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar51 = local_4c8;
    } while (uVar69 < (ulong)(((long)(local_4c8->m_subpasses).
                                     super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar48 >> 4
                              ) * 0x6db6db6db6db6db7));
    pAVar29 = (local_4c8->m_attachments).
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar37 = (local_4c8->m_attachments).
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pAVar37 != pAVar29) {
    local_518 = referenceValues.
                super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    lVar61 = 0;
    local_4f0 = 0x800000000000003f;
    uVar69 = 0;
    do {
      TVar26 = ::vk::mapVkFormat(*(VkFormat *)((long)&pAVar29->m_format + lVar61));
      bVar19 = tcu::hasStencilComponent(TVar26.order);
      bVar20 = tcu::hasDepthComponent(TVar26.order);
      uVar66 = uVar69 + 0x3f;
      if (-1 < (long)uVar69) {
        uVar66 = uVar69;
      }
      lVar70 = ((long)uVar66 >> 6) * 8;
      uVar66 = (ulong)((uVar69 & local_4f0) < 0x8000000000000001);
      if (((*(ulong *)((long)depthAccess.super_ConstPixelBufferAccess.m_format + lVar70 + -8 +
                      uVar66 * 8) >> (uVar69 & 0x3f) & 1) != 0) &&
         (*(int *)((long)&((local_4c8->m_attachments).
                           super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_storeOp + lVar61) == 1)) {
        if (bVar20 || bVar19) {
          format.order = 1;
        }
        else {
          format.order = 0x1010101;
        }
        markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                       *)(local_518->
                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         )._M_impl.super__Vector_impl_data._M_start,(BVec4 *)&format,
                      (UVec2 *)(ulong)targetSize->m_data[0],
                      (UVec2 *)(ulong)(config->renderPos).m_data[0],
                      (UVec2 *)(ulong)(config->renderPos).m_data[1]);
      }
      pRVar51 = local_4c8;
      pAVar29 = (local_4c8->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((bVar19 && (*(ulong *)(uVar66 * 8 + -8 +
                                lVar70 + (long)depthAccess.super_ConstPixelBufferAccess.m_format) &
                     1L << ((byte)uVar69 & 0x3f)) != 0) &&
         (*(int *)((long)&pAVar29->m_stencilStoreOp + lVar61) == 1)) {
        format.order = 0x100;
        markUndefined((vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                       *)(local_518->
                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         )._M_impl.super__Vector_impl_data._M_start,(BVec4 *)&format,
                      (UVec2 *)(ulong)targetSize->m_data[0],
                      (UVec2 *)(ulong)(config->renderPos).m_data[0],
                      (UVec2 *)(ulong)(config->renderPos).m_data[1]);
        pAVar29 = (pRVar51->m_attachments).
                  super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar69 = uVar69 + 1;
      lVar61 = lVar61 + 0x20;
      local_518 = local_518 + 1;
    } while (uVar69 < (ulong)((long)(pRVar51->m_attachments).
                                    super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar29 >> 5)
            );
  }
  if (depthAccess.super_ConstPixelBufferAccess.m_format != (TextureFormat)0x0) {
    operator_delete((void *)depthAccess.super_ConstPixelBufferAccess.m_format,
                    (long)depthAccess.super_ConstPixelBufferAccess.m_data -
                    (long)depthAccess.super_ConstPixelBufferAccess.m_format);
  }
  pvVar25 = referenceValues.
            super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar38 = referenceValues.
            super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::resize
            (&referenceAttachments,
             ((long)referenceValues.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)referenceValues.
                    super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pAVar29 = (pRVar51->m_attachments).
            super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_4c0 = (pointer)CONCAT44(local_4c0._4_4_,(int)CONCAT71((int7)((ulong)pvVar38 >> 8),1));
  if ((pRVar51->m_attachments).
      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar29) {
    uVar69 = 0;
    do {
      format_3 = ::vk::mapVkFormat(pAVar29[uVar69].m_format);
      bVar19 = tcu::hasDepthComponent(format_3.order);
      bVar20 = tcu::hasStencilComponent(format_3.order);
      pTVar58 = referenceAttachments.
                super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
                super__Vector_impl_data._M_start + uVar69;
      tcu::TextureLevel::setStorage(pTVar58,&format_3,targetSize->m_data[0],targetSize->m_data[1],1)
      ;
      pvVar38 = pvVar25 + uVar69;
      local_4f0 = uVar69;
      if (bVar19 || bVar20) {
        if (bVar19) {
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&format,pTVar58);
          tcu::getEffectiveDepthStencilAccess(&depthAccess,(PixelBufferAccess *)&format,MODE_DEPTH);
          uVar73 = targetSize->m_data[1];
          if (uVar73 != 0) {
            uVar74 = targetSize->m_data[0];
            uVar34 = 0;
            do {
              uVar45 = 0;
              if (uVar74 != 0) {
                uVar69 = 0;
                do {
                  iVar59 = (int)uVar69;
                  uVar22 = (pvVar38->
                           super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar74 * uVar34 + iVar59].
                           m_status;
                  if ((uVar22 & 1) == 0) {
                    fVar75 = *(float *)(&DAT_00a99874 +
                                       (ulong)((((uint)(uVar69 * 0xaaaaaaab >> 0x20) ^
                                                (uint)((ulong)uVar34 * 0xaaaaaaab >> 0x20)) >> 1 & 1
                                               ) == 0) * 4);
                  }
                  else {
                    fVar75 = 0.0;
                    if ((uVar22 & 2) != 0) {
                      fVar75 = 1.0;
                    }
                  }
                  tcu::PixelBufferAccess::setPixDepth(&depthAccess,fVar75,iVar59,uVar34,0);
                  uVar69 = (ulong)(iVar59 + 1U);
                  uVar74 = targetSize->m_data[0];
                } while (iVar59 + 1U < uVar74);
                uVar73 = targetSize->m_data[1];
                uVar45 = uVar74;
              }
              uVar74 = uVar45;
              uVar34 = uVar34 + 1;
            } while (uVar34 < uVar73);
          }
        }
        if (bVar20) {
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&format,pTVar58);
          tcu::getEffectiveDepthStencilAccess
                    (&depthAccess,(PixelBufferAccess *)&format,MODE_STENCIL);
          uVar73 = targetSize->m_data[1];
          if (uVar73 != 0) {
            uVar74 = targetSize->m_data[0];
            uVar34 = 0;
            do {
              uVar45 = 0;
              if (uVar74 != 0) {
                uVar69 = 0;
                do {
                  iVar59 = (int)uVar69;
                  uVar22 = (pvVar38->
                           super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar74 * uVar34 + iVar59].
                           m_status;
                  if ((uVar22 & 4) == 0) {
                    uVar73 = 0xaa;
                    if ((((uint)(uVar69 * 0xaaaaaaab >> 0x20) ^
                         (uint)((ulong)uVar34 * 0xaaaaaaab >> 0x20)) >> 1 & 1) == 0) {
                      uVar73 = 0x55;
                    }
                  }
                  else {
                    uVar73 = uVar22 & 8;
                    if ((uVar22 & 8) != 0) {
                      uVar73 = 0xff;
                    }
                  }
                  tcu::PixelBufferAccess::setPixStencil(&depthAccess,uVar73,iVar59,uVar34,0);
                  uVar69 = (ulong)(iVar59 + 1U);
                  uVar74 = targetSize->m_data[0];
                } while (iVar59 + 1U < uVar74);
                uVar73 = targetSize->m_data[1];
                uVar45 = uVar74;
              }
              uVar74 = uVar45;
              uVar34 = uVar34 + 1;
            } while (uVar34 < uVar73);
          }
        }
      }
      else {
        uVar73 = targetSize->m_data[1];
        if (uVar73 != 0) {
          uVar74 = targetSize->m_data[0];
          uVar34 = 0;
          do {
            uVar45 = 0;
            if (uVar74 != 0) {
              uVar69 = 0;
              do {
                iVar59 = (int)uVar69;
                uVar69 = uVar69 / 3;
                _format = (VkClearValue)0x0;
                uVar22 = (pvVar38->
                         super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar74 * uVar34 + iVar59].
                         m_status;
                lVar61 = 0;
                do {
                  if ((uVar22 >> ((uint)lVar61 & 0x1f) & 1) == 0) {
                    *(undefined4 *)((long)&format.order + lVar61 * 2) =
                         *(undefined4 *)
                          (&DAT_00a99874 + (ulong)((((uint)uVar69 ^ uVar34 / 3) & 1) == 0) * 4);
                  }
                  else if ((uVar22 >> ((byte)lVar61 & 0x1f) & 2) == 0) {
                    *(undefined4 *)((long)&format.order + lVar61 * 2) = 0;
                  }
                  else {
                    *(undefined4 *)((long)&format.order + lVar61 * 2) = 0x3f800000;
                  }
                  lVar61 = lVar61 + 2;
                  uVar69 = (ulong)((uint)uVar69 + 1);
                } while (lVar61 != 8);
                tcu::TextureLevel::getAccess(&depthAccess,pTVar58);
                tcu::PixelBufferAccess::setPixel(&depthAccess,(Vec4 *)&format,iVar59,uVar34,0);
                uVar69 = (ulong)(iVar59 + 1U);
                uVar74 = targetSize->m_data[0];
              } while (iVar59 + 1U < uVar74);
              uVar73 = targetSize->m_data[1];
              uVar45 = uVar74;
            }
            uVar74 = uVar45;
            uVar34 = uVar34 + 1;
          } while (uVar34 < uVar73);
        }
      }
      uVar69 = local_4f0 + 1;
      pAVar29 = (local_4c8->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar37 = (local_4c8->m_attachments).
                super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar69 < (ulong)((long)pAVar37 - (long)pAVar29 >> 5));
    if (pAVar37 != pAVar29) {
      local_4c0 = (pointer)CONCAT44(local_4c0._4_4_,(int)CONCAT71((int7)((ulong)pAVar37 >> 8),1));
      uVar69 = 0;
      pRVar51 = local_4c8;
      do {
        uVar66 = uVar69 + 0x3f;
        if (-1 < (long)uVar69) {
          uVar66 = uVar69;
        }
        if (((attachmentIsLazy->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)uVar66 >> 6) +
              (ulong)((uVar69 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar69 & 0x3f) & 1) == 0) {
          local_4f0 = uVar69 * 0x20;
          format_00 = pAVar29[uVar69].m_format;
          format_7 = ::vk::mapVkFormat(format_00);
          bVar19 = tcu::hasDepthComponent(format_7.order);
          iVar59 = (int)log;
          if (bVar19) {
            bVar19 = tcu::hasStencilComponent(format_7.order);
            if (bVar19) {
              depthFormat = ::vk::getDepthCopyFormat(format_00);
              uVar73 = targetSize->m_data[0];
              uVar74 = targetSize->m_data[1];
              iVar76 = tcu::TextureFormat::getPixelSize(&depthFormat);
              pvVar12 = *(void **)(*(long *)&(((attachmentResources->
                                               super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar69].
                                              m_ptr)->m_bufferMemory).
                                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                             .m_data + 0x18);
              stencilFormat = ::vk::getStencilCopyFormat(format_00);
              uVar34 = targetSize->m_data[0];
              uVar45 = targetSize->m_data[1];
              iVar79 = tcu::TextureFormat::getPixelSize(&stencilFormat);
              local_308 = (ulong)(uVar74 * uVar73 * iVar76);
              local_2e0 = (ulong)(uVar45 * uVar34 * iVar79);
              pSVar13 = (attachmentResources->
                        super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              data = *(void **)(*(long *)&((pSVar13[uVar69].m_ptr)->m_secondaryBufferMemory).
                                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                          .m_data + 0x18);
              format_3.order = RA;
              local_320.m_align = 0;
              local_318 = *(undefined8 *)
                           (*(long *)&((pSVar13[uVar69].m_ptr)->m_bufferMemory).
                                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                      .m_data + 8);
              local_310 = *(undefined8 *)
                           (*(long *)&((pSVar13[uVar69].m_ptr)->m_bufferMemory).
                                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                      .m_data + 0x10);
              local_300 = 6;
              local_2f8 = 0;
              local_2f0 = *(undefined8 *)
                           (*(long *)&((pSVar13[uVar69].m_ptr)->m_secondaryBufferMemory).
                                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                      .m_data + 8);
              local_2e8 = *(undefined8 *)
                           (*(long *)&((pSVar13[uVar69].m_ptr)->m_secondaryBufferMemory).
                                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                      .m_data + 0x10);
              VVar24 = (*vk->_vptr_DeviceInterface[10])(vk,device,2,&format_3);
              ::vk::checkResult(VVar24,"vk.invalidateMappedMemoryRanges(device, 2u, ranges)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                                ,0xd35);
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&depthAccess_1,&depthFormat,targetSize->m_data[0],targetSize->m_data[1],1,
                         pvVar12);
              paVar2 = &local_510.field_2;
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&stencilAccess_1,&stencilFormat,targetSize->m_data[0],targetSize->m_data[1]
                         ,1,data);
              depthAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
              depthAccess.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
              pCVar43 = &depthAccess.super_ConstPixelBufferAccess;
              tcu::TextureLevel::TextureLevel
                        (&depthErrorImage,&pCVar43->m_format,targetSize->m_data[0],
                         targetSize->m_data[1],1);
              depthAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
              depthAccess.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
              tcu::TextureLevel::TextureLevel
                        (&stencilErrorImage,&pCVar43->m_format,targetSize->m_data[0],
                         targetSize->m_data[1],1);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
              uVar66 = local_4f0;
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_440,0,(char *)0x0,0xaab8fd);
              local_4e8 = &local_4d8;
              plVar39 = plVar30 + 2;
              if ((long *)*plVar30 == plVar39) {
                local_4d8 = *plVar39;
                lStack_4d0 = plVar30[3];
              }
              else {
                local_4d8 = *plVar39;
                local_4e8 = (long *)*plVar30;
              }
              local_4e0 = plVar30[1];
              *plVar30 = (long)plVar39;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              plVar30 = (long *)std::__cxx11::string::append((char *)&local_4e8);
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510.field_2._8_8_ = plVar30[3];
                local_510._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_510._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_98,0,(char *)0x0,0xa99e38);
              local_2a0 = &local_290;
              plVar39 = plVar30 + 2;
              if ((long *)*plVar30 == plVar39) {
                local_290 = *plVar39;
                lStack_288 = plVar30[3];
              }
              else {
                local_290 = *plVar39;
                local_2a0 = (long *)*plVar30;
              }
              local_298 = plVar30[1];
              *plVar30 = (long)plVar39;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              plVar30 = (long *)std::__cxx11::string::append((char *)&local_2a0);
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_418.field_2._M_allocated_capacity = *psVar41;
                local_418.field_2._8_8_ = plVar30[3];
              }
              else {
                local_418.field_2._M_allocated_capacity = *psVar41;
                local_418._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_418._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              pCVar42 = &depthAccess_1;
              tcu::LogImage::LogImage
                        ((LogImage *)&format,&local_510,&local_418,pCVar42,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)&format,iVar59,__buf_01,(size_t)pCVar42);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_p != local_3b8) {
                operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
              }
              if (format != (TextureFormat)&local_3d8) {
                operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != &local_418.field_2) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if (local_2a0 != &local_290) {
                operator_delete(local_2a0,local_290 + 1);
              }
              if (local_98[0] != local_88) {
                operator_delete(local_98[0],local_88[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != paVar2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
              if (local_4e8 != &local_4d8) {
                operator_delete(local_4e8,local_4d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p != &local_440.field_2) {
                operator_delete(local_440._M_dataplus._M_p,
                                local_440.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_440,0,(char *)0x0,0xaab8fd);
              local_4e8 = &local_4d8;
              plVar39 = plVar30 + 2;
              if ((long *)*plVar30 == plVar39) {
                local_4d8 = *plVar39;
                lStack_4d0 = plVar30[3];
              }
              else {
                local_4d8 = *plVar39;
                local_4e8 = (long *)*plVar30;
              }
              local_4e0 = plVar30[1];
              *plVar30 = (long)plVar39;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              plVar30 = (long *)std::__cxx11::string::append((char *)&local_4e8);
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510.field_2._8_8_ = plVar30[3];
                local_510._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_510._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_98,0,(char *)0x0,0xa99e38);
              local_2a0 = &local_290;
              plVar39 = plVar30 + 2;
              if ((long *)*plVar30 == plVar39) {
                local_290 = *plVar39;
                lStack_288 = plVar30[3];
              }
              else {
                local_290 = *plVar39;
                local_2a0 = (long *)*plVar30;
              }
              local_298 = plVar30[1];
              *plVar30 = (long)plVar39;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              plVar30 = (long *)std::__cxx11::string::append((char *)&local_2a0);
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_418.field_2._M_allocated_capacity = *psVar41;
                local_418.field_2._8_8_ = plVar30[3];
              }
              else {
                local_418.field_2._M_allocated_capacity = *psVar41;
                local_418._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_418._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              pCVar42 = &stencilAccess_1;
              tcu::LogImage::LogImage
                        ((LogImage *)&format,&local_510,&local_418,pCVar42,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)&format,iVar59,__buf_02,(size_t)pCVar42);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_p != local_3b8) {
                operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
              }
              if (format != (TextureFormat)&local_3d8) {
                operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != &local_418.field_2) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if (local_2a0 != &local_290) {
                operator_delete(local_2a0,local_290 + 1);
              }
              if (local_98[0] != local_88) {
                operator_delete(local_98[0],local_88[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != paVar2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
              if (local_4e8 != &local_4d8) {
                operator_delete(local_4e8,local_4d8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p != &local_440.field_2) {
                operator_delete(local_440._M_dataplus._M_p,
                                local_440.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_4e8,0,(char *)0x0,0xa9a30e);
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510.field_2._8_8_ = plVar30[3];
                local_510._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_510._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
              std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_418,0,(char *)0x0,0xa9a322);
              local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_440.field_2._M_allocated_capacity = *psVar41;
                local_440.field_2._8_8_ = plVar30[3];
              }
              else {
                local_440.field_2._M_allocated_capacity = *psVar41;
                local_440._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_440._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)pCVar43,
                         referenceAttachments.
                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar69);
              pCVar42 = pCVar43;
              tcu::LogImage::LogImage
                        ((LogImage *)&format,&local_510,&local_440,pCVar43,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)&format,iVar59,__buf_03,(size_t)pCVar42);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_p != local_3b8) {
                operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
              }
              if (format != (TextureFormat)&local_3d8) {
                operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p != &local_440.field_2) {
                operator_delete(local_440._M_dataplus._M_p,
                                local_440.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_418._M_dataplus._M_p != &local_418.field_2) {
                operator_delete(local_418._M_dataplus._M_p,
                                local_418.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != paVar2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
              if (local_4e8 != &local_4d8) {
                operator_delete(local_4e8,local_4d8 + 1);
              }
              if (*(int *)((long)&((local_4c8->m_attachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_storeOp + uVar66)
                  == 0) {
                pvVar25 = referenceValues.
                          super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar43,&depthErrorImage);
                bVar19 = verifyDepthAttachment
                                   (pvVar25 + uVar69,&depthAccess_1,(PixelBufferAccess *)pCVar43);
                if (!bVar19) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
                  std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
                  std::ios_base::~ios_base(local_1c8);
                  plVar30 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_4e8,0,(char *)0x0,0xa9a338);
                  psVar41 = (size_type *)(plVar30 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar30 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar41) {
                    local_510.field_2._M_allocated_capacity = *psVar41;
                    local_510.field_2._8_8_ = plVar30[3];
                    local_510._M_dataplus._M_p = (pointer)paVar2;
                  }
                  else {
                    local_510.field_2._M_allocated_capacity = *psVar41;
                    local_510._M_dataplus._M_p = (pointer)*plVar30;
                  }
                  local_510._M_string_length = plVar30[1];
                  *plVar30 = (long)psVar41;
                  plVar30[1] = 0;
                  *(undefined1 *)(plVar30 + 2) = 0;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
                  std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
                  std::ios_base::~ios_base(local_1c8);
                  plVar30 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_418,0,(char *)0x0,0xa9a34d);
                  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
                  psVar41 = (size_type *)(plVar30 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar30 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar41) {
                    local_440.field_2._M_allocated_capacity = *psVar41;
                    local_440.field_2._8_8_ = plVar30[3];
                  }
                  else {
                    local_440.field_2._M_allocated_capacity = *psVar41;
                    local_440._M_dataplus._M_p = (pointer)*plVar30;
                  }
                  local_440._M_string_length = plVar30[1];
                  *plVar30 = (long)psVar41;
                  plVar30[1] = 0;
                  *(undefined1 *)(plVar30 + 2) = 0;
                  tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar43,&depthErrorImage);
                  pCVar42 = pCVar43;
                  tcu::LogImage::LogImage
                            ((LogImage *)&format,&local_510,&local_440,pCVar43,
                             QP_IMAGE_COMPRESSION_MODE_BEST);
                  tcu::LogImage::write((LogImage *)&format,iVar59,__buf_10,(size_t)pCVar42);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_p != local_3b8) {
                    operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
                  }
                  if (format != (TextureFormat)&local_3d8) {
                    operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p != &local_440.field_2) {
                    operator_delete(local_440._M_dataplus._M_p,
                                    local_440.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,
                                    local_418.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p != paVar2) {
                    operator_delete(local_510._M_dataplus._M_p,
                                    local_510.field_2._M_allocated_capacity + 1);
                  }
                  if (local_4e8 != &local_4d8) {
                    operator_delete(local_4e8,local_4d8 + 1);
                  }
                  local_4c0 = (pointer)((ulong)local_4c0 & 0xffffffff00000000);
                }
              }
              if (*(int *)((long)&((local_4c8->m_attachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_stencilStoreOp +
                          uVar66) == 0) {
                pvVar25 = referenceValues.
                          super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar43,&stencilErrorImage);
                bVar19 = verifyStencilAttachment
                                   (pvVar25 + uVar69,&stencilAccess_1,(PixelBufferAccess *)pCVar43);
                if (!bVar19) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
                  std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
                  std::ios_base::~ios_base(local_1c8);
                  plVar30 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_4e8,0,(char *)0x0,0xa9a365);
                  psVar41 = (size_type *)(plVar30 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar30 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar41) {
                    local_510.field_2._M_allocated_capacity = *psVar41;
                    local_510.field_2._8_8_ = plVar30[3];
                    local_510._M_dataplus._M_p = (pointer)paVar2;
                  }
                  else {
                    local_510.field_2._M_allocated_capacity = *psVar41;
                    local_510._M_dataplus._M_p = (pointer)*plVar30;
                  }
                  local_510._M_string_length = plVar30[1];
                  *plVar30 = (long)psVar41;
                  plVar30[1] = 0;
                  *(undefined1 *)(plVar30 + 2) = 0;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)pCVar43);
                  std::ostream::_M_insert<unsigned_long>((ulong)pCVar43);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pCVar43);
                  std::ios_base::~ios_base(local_1c8);
                  plVar30 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_418,0,(char *)0x0,0xa9a37c);
                  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
                  psVar41 = (size_type *)(plVar30 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar30 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar41) {
                    local_440.field_2._M_allocated_capacity = *psVar41;
                    local_440.field_2._8_8_ = plVar30[3];
                  }
                  else {
                    local_440.field_2._M_allocated_capacity = *psVar41;
                    local_440._M_dataplus._M_p = (pointer)*plVar30;
                  }
                  local_440._M_string_length = plVar30[1];
                  *plVar30 = (long)psVar41;
                  plVar30[1] = 0;
                  *(undefined1 *)(plVar30 + 2) = 0;
                  tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar43,&stencilErrorImage);
                  tcu::LogImage::LogImage
                            ((LogImage *)&format,&local_510,&local_440,pCVar43,
                             QP_IMAGE_COMPRESSION_MODE_BEST);
                  tcu::LogImage::write((LogImage *)&format,iVar59,__buf_11,(size_t)pCVar43);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_p != local_3b8) {
                    operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
                  }
                  if (format != (TextureFormat)&local_3d8) {
                    operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_440._M_dataplus._M_p != &local_440.field_2) {
                    operator_delete(local_440._M_dataplus._M_p,
                                    local_440.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p != &local_418.field_2) {
                    operator_delete(local_418._M_dataplus._M_p,
                                    local_418.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p != paVar2) {
                    operator_delete(local_510._M_dataplus._M_p,
                                    local_510.field_2._M_allocated_capacity + 1);
                  }
                  if (local_4e8 != &local_4d8) {
                    operator_delete(local_4e8,local_4d8 + 1);
                  }
                  local_4c0 = (pointer)((ulong)local_4c0 & 0xffffffff00000000);
                }
              }
              tcu::TextureLevel::~TextureLevel(&stencilErrorImage);
              tcu::TextureLevel::~TextureLevel(&depthErrorImage);
              pRVar51 = local_4c8;
              goto LAB_003aa960;
            }
          }
          uVar73 = targetSize->m_data[0];
          uVar74 = targetSize->m_data[1];
          iVar76 = tcu::TextureFormat::getPixelSize(&format_7);
          local_308 = (ulong)(uVar74 * uVar73 * iVar76);
          pSVar13 = (attachmentResources->
                    super__Vector_base<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::AttachmentResources>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar61 = *(long *)&((pSVar13[uVar69].m_ptr)->m_bufferMemory).
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data;
          pvVar12 = *(void **)(lVar61 + 0x18);
          format_3.order = RA;
          local_320.m_align = 0;
          local_318 = *(undefined8 *)(lVar61 + 8);
          local_310 = *(undefined8 *)
                       (*(long *)&((pSVar13[uVar69].m_ptr)->m_bufferMemory).
                                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                  .m_data + 0x10);
          VVar24 = (*vk->_vptr_DeviceInterface[10])(vk,device,1,&format_3);
          pRVar51 = local_4c8;
          ::vk::checkResult(VVar24,"vk.invalidateMappedMemoryRanges(device, 1u, &range)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/vktRenderPassTests.cpp"
                            ,0xd5e);
          bVar19 = tcu::hasDepthComponent(format_7.order);
          if (bVar19) {
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                      (&depthAccess_1,&format_7,targetSize->m_data[0],targetSize->m_data[1],1,
                       pvVar12);
            depthAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
            depthAccess.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
            tcu::TextureLevel::TextureLevel
                      ((TextureLevel *)&stencilAccess_1,(TextureFormat *)&depthAccess,
                       targetSize->m_data[0],targetSize->m_data[1],1);
            paVar2 = &local_510.field_2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
            TVar26 = (TextureFormat)(depthErrorImage.m_size.m_data + 2);
            std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
            std::ios_base::~ios_base(local_1c8);
            pTVar31 = (TextureFormat *)
                      std::__cxx11::string::replace
                                ((ulong)&stencilErrorImage,0,(char *)0x0,0xaab8fd);
            TVar40 = (TextureFormat)(pTVar31 + 2);
            if (*pTVar31 == TVar40) {
              depthErrorImage._16_8_ = *(undefined8 *)TVar40;
              depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
              depthErrorImage.m_format = TVar26;
            }
            else {
              depthErrorImage._16_8_ = *(undefined8 *)TVar40;
              depthErrorImage.m_format = *pTVar31;
            }
            depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
            *pTVar31 = TVar40;
            pTVar31[1].order = R;
            pTVar31[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar31[2].order = R;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
            std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
            std::ios_base::~ios_base(local_1c8);
            plVar30 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_4e8,0,(char *)0x0,0xa99e38);
            psVar41 = (size_type *)(plVar30 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar30 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar41) {
              local_510.field_2._M_allocated_capacity = *psVar41;
              local_510.field_2._8_8_ = plVar30[3];
              local_510._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_510.field_2._M_allocated_capacity = *psVar41;
              local_510._M_dataplus._M_p = (pointer)*plVar30;
            }
            local_510._M_string_length = plVar30[1];
            *plVar30 = (long)psVar41;
            plVar30[1] = 0;
            *(undefined1 *)(plVar30 + 2) = 0;
            pCVar43 = &depthAccess_1;
            tcu::LogImage::LogImage
                      ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)&format,iVar59,__buf,(size_t)pCVar43);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_p != local_3b8) {
              operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
            }
            if (format != (TextureFormat)&local_3d8) {
              operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != paVar2) {
              operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4e8 != &local_4d8) {
              operator_delete(local_4e8,local_4d8 + 1);
            }
            if (depthErrorImage.m_format != TVar26) {
              operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
            }
            if (stencilErrorImage.m_format != (TextureFormat)(stencilErrorImage.m_size.m_data + 2))
            {
              operator_delete((void *)stencilErrorImage.m_format,stencilErrorImage._16_8_ + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
            std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
            std::ios_base::~ios_base(local_1c8);
            pTVar31 = (TextureFormat *)
                      std::__cxx11::string::replace
                                ((ulong)&stencilErrorImage,0,(char *)0x0,0xa9a30e);
            TVar40 = (TextureFormat)(pTVar31 + 2);
            if (*pTVar31 == TVar40) {
              depthErrorImage._16_8_ = *(undefined8 *)TVar40;
              depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
              depthErrorImage.m_format = TVar26;
            }
            else {
              depthErrorImage._16_8_ = *(undefined8 *)TVar40;
              depthErrorImage.m_format = *pTVar31;
            }
            depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
            *pTVar31 = TVar40;
            pTVar31[1].order = R;
            pTVar31[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar31[2].order = R;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
            std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
            std::ios_base::~ios_base(local_1c8);
            plVar30 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_4e8,0,(char *)0x0,0xa9a322);
            psVar41 = (size_type *)(plVar30 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar30 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar41) {
              local_510.field_2._M_allocated_capacity = *psVar41;
              local_510.field_2._8_8_ = plVar30[3];
              local_510._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_510.field_2._M_allocated_capacity = *psVar41;
              local_510._M_dataplus._M_p = (pointer)*plVar30;
            }
            local_510._M_string_length = plVar30[1];
            *plVar30 = (long)psVar41;
            plVar30[1] = 0;
            *(undefined1 *)(plVar30 + 2) = 0;
            pCVar43 = &depthAccess.super_ConstPixelBufferAccess;
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)pCVar43,
                       referenceAttachments.
                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar69);
            tcu::LogImage::LogImage
                      ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)&format,iVar59,__buf_00,(size_t)pCVar43);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_p != local_3b8) {
              operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
            }
            if (format != (TextureFormat)&local_3d8) {
              operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != paVar2) {
              operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4e8 != &local_4d8) {
              operator_delete(local_4e8,local_4d8 + 1);
            }
            if (depthErrorImage.m_format != TVar26) {
              operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
            }
            if (stencilErrorImage.m_format != (TextureFormat)(stencilErrorImage.m_size.m_data + 2))
            {
              operator_delete((void *)stencilErrorImage.m_format,stencilErrorImage._16_8_ + 1);
            }
            pAVar29 = (pRVar51->m_attachments).
                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(int *)((long)&pAVar29->m_storeOp + local_4f0) == 0) ||
               (*(int *)((long)&pAVar29->m_stencilStoreOp + local_4f0) == 0)) {
              pvVar25 = referenceValues.
                        super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              tcu::TextureLevel::getAccess(&depthAccess,(TextureLevel *)&stencilAccess_1);
              bVar19 = verifyDepthAttachment(pvVar25 + uVar69,&depthAccess_1,&depthAccess);
              pRVar51 = local_4c8;
              if (!bVar19) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
                std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
                std::__cxx11::stringbuf::str();
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
                std::ios_base::~ios_base(local_1c8);
                pTVar31 = (TextureFormat *)
                          std::__cxx11::string::replace
                                    ((ulong)&stencilErrorImage,0,(char *)0x0,0xa9a33d);
                TVar40 = (TextureFormat)(pTVar31 + 2);
                if (*pTVar31 == TVar40) {
                  depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                  depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
                  depthErrorImage.m_format = TVar26;
                }
                else {
                  depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                  depthErrorImage.m_format = *pTVar31;
                }
                depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
                *pTVar31 = TVar40;
                pTVar31[1].order = R;
                pTVar31[1].type = SNORM_INT8;
                *(undefined1 *)&pTVar31[2].order = R;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
                std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
                std::__cxx11::stringbuf::str();
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
                std::ios_base::~ios_base(local_1c8);
                plVar30 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_4e8,0,(char *)0x0,0xa9a353);
                psVar41 = (size_type *)(plVar30 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar30 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar41) {
                  local_510.field_2._M_allocated_capacity = *psVar41;
                  local_510.field_2._8_8_ = plVar30[3];
                  local_510._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_510.field_2._M_allocated_capacity = *psVar41;
                  local_510._M_dataplus._M_p = (pointer)*plVar30;
                }
                local_510._M_string_length = plVar30[1];
                *plVar30 = (long)psVar41;
                plVar30[1] = 0;
                *(undefined1 *)(plVar30 + 2) = 0;
                pCVar43 = &depthAccess.super_ConstPixelBufferAccess;
                tcu::TextureLevel::getAccess
                          ((PixelBufferAccess *)pCVar43,(TextureLevel *)&stencilAccess_1);
                tcu::LogImage::LogImage
                          ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
                tcu::LogImage::write((LogImage *)&format,iVar59,__buf_08,(size_t)pCVar43);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c8._M_p != local_3b8) {
                  operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
                }
                if (format != (TextureFormat)&local_3d8) {
                  operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_510._M_dataplus._M_p != paVar2) {
                  operator_delete(local_510._M_dataplus._M_p,
                                  local_510.field_2._M_allocated_capacity + 1);
                }
                if (local_4e8 != &local_4d8) {
                  operator_delete(local_4e8,local_4d8 + 1);
                }
                if (depthErrorImage.m_format != TVar26) {
                  operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
                }
                if (stencilErrorImage.m_format !=
                    (TextureFormat)(stencilErrorImage.m_size.m_data + 2)) {
                  operator_delete((void *)stencilErrorImage.m_format,stencilErrorImage._16_8_ + 1);
                }
                local_4c0 = (pointer)((ulong)local_4c0 & 0xffffffff00000000);
              }
            }
          }
          else {
            bVar19 = tcu::hasStencilComponent(format_7.order);
            if (bVar19) {
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&depthAccess_1,&format_7,targetSize->m_data[0],targetSize->m_data[1],1,
                         pvVar12);
              depthAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
              depthAccess.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
              tcu::TextureLevel::TextureLevel
                        ((TextureLevel *)&stencilAccess_1,(TextureFormat *)&depthAccess,
                         targetSize->m_data[0],targetSize->m_data[1],1);
              paVar2 = &local_510.field_2;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
              TVar26 = (TextureFormat)(depthErrorImage.m_size.m_data + 2);
              std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
              std::ios_base::~ios_base(local_1c8);
              pTVar31 = (TextureFormat *)
                        std::__cxx11::string::replace
                                  ((ulong)&stencilErrorImage,0,(char *)0x0,0xaab8fd);
              TVar40 = (TextureFormat)(pTVar31 + 2);
              if (*pTVar31 == TVar40) {
                depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
                depthErrorImage.m_format = TVar26;
              }
              else {
                depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                depthErrorImage.m_format = *pTVar31;
              }
              depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
              *pTVar31 = TVar40;
              pTVar31[1].order = R;
              pTVar31[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar31[2].order = R;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
              std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_4e8,0,(char *)0x0,0xa99e38);
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510.field_2._8_8_ = plVar30[3];
                local_510._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_510._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              pCVar43 = &depthAccess_1;
              tcu::LogImage::LogImage
                        ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)&format,iVar59,__buf_04,(size_t)pCVar43);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_p != local_3b8) {
                operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
              }
              if (format != (TextureFormat)&local_3d8) {
                operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != paVar2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
              if (local_4e8 != &local_4d8) {
                operator_delete(local_4e8,local_4d8 + 1);
              }
              if (depthErrorImage.m_format != TVar26) {
                operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
              }
              if (stencilErrorImage.m_format != (TextureFormat)(stencilErrorImage.m_size.m_data + 2)
                 ) {
                operator_delete((void *)stencilErrorImage.m_format,stencilErrorImage._16_8_ + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
              std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
              std::ios_base::~ios_base(local_1c8);
              pTVar31 = (TextureFormat *)
                        std::__cxx11::string::replace
                                  ((ulong)&stencilErrorImage,0,(char *)0x0,0xa9a30e);
              TVar40 = (TextureFormat)(pTVar31 + 2);
              if (*pTVar31 == TVar40) {
                depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
                depthErrorImage.m_format = TVar26;
              }
              else {
                depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                depthErrorImage.m_format = *pTVar31;
              }
              depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
              *pTVar31 = TVar40;
              pTVar31[1].order = R;
              pTVar31[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar31[2].order = R;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
              std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_4e8,0,(char *)0x0,0xa9a322);
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510.field_2._8_8_ = plVar30[3];
                local_510._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_510._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              pCVar43 = &depthAccess.super_ConstPixelBufferAccess;
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)pCVar43,
                         referenceAttachments.
                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar69);
              tcu::LogImage::LogImage
                        ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)&format,iVar59,__buf_06,(size_t)pCVar43);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_p != local_3b8) {
                operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
              }
              if (format != (TextureFormat)&local_3d8) {
                operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != paVar2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
              if (local_4e8 != &local_4d8) {
                operator_delete(local_4e8,local_4d8 + 1);
              }
              if (depthErrorImage.m_format != TVar26) {
                operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
              }
              if (stencilErrorImage.m_format != (TextureFormat)(stencilErrorImage.m_size.m_data + 2)
                 ) {
                operator_delete((void *)stencilErrorImage.m_format,stencilErrorImage._16_8_ + 1);
              }
              pAVar29 = (pRVar51->m_attachments).
                        super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((*(int *)((long)&pAVar29->m_storeOp + local_4f0) == 0) ||
                 (*(int *)((long)&pAVar29->m_stencilStoreOp + local_4f0) == 0)) {
                pvVar25 = referenceValues.
                          super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                tcu::TextureLevel::getAccess(&depthAccess,(TextureLevel *)&stencilAccess_1);
                bVar19 = verifyStencilAttachment(pvVar25 + uVar69,&depthAccess_1,&depthAccess);
                pRVar51 = local_4c8;
                if (!bVar19) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
                  std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
                  std::ios_base::~ios_base(local_1c8);
                  pTVar31 = (TextureFormat *)
                            std::__cxx11::string::replace
                                      ((ulong)&stencilErrorImage,0,(char *)0x0,0xa9a33d);
                  TVar40 = (TextureFormat)(pTVar31 + 2);
                  if (*pTVar31 == TVar40) {
                    depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                    depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
                    depthErrorImage.m_format = TVar26;
                  }
                  else {
                    depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                    depthErrorImage.m_format = *pTVar31;
                  }
                  depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
                  *pTVar31 = TVar40;
                  pTVar31[1].order = R;
                  pTVar31[1].type = SNORM_INT8;
                  *(undefined1 *)&pTVar31[2].order = R;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
                  std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
                  std::ios_base::~ios_base(local_1c8);
                  plVar30 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_4e8,0,(char *)0x0,0xa9a353);
                  psVar41 = (size_type *)(plVar30 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar30 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar41) {
                    local_510.field_2._M_allocated_capacity = *psVar41;
                    local_510.field_2._8_8_ = plVar30[3];
                    local_510._M_dataplus._M_p = (pointer)paVar2;
                  }
                  else {
                    local_510.field_2._M_allocated_capacity = *psVar41;
                    local_510._M_dataplus._M_p = (pointer)*plVar30;
                  }
                  local_510._M_string_length = plVar30[1];
                  *plVar30 = (long)psVar41;
                  plVar30[1] = 0;
                  *(undefined1 *)(plVar30 + 2) = 0;
                  pCVar43 = &depthAccess.super_ConstPixelBufferAccess;
                  tcu::TextureLevel::getAccess
                            ((PixelBufferAccess *)pCVar43,(TextureLevel *)&stencilAccess_1);
                  tcu::LogImage::LogImage
                            ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                             QP_IMAGE_COMPRESSION_MODE_BEST);
                  tcu::LogImage::write((LogImage *)&format,iVar59,__buf_09,(size_t)pCVar43);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3c8._M_p != local_3b8) {
                    operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
                  }
                  if (format != (TextureFormat)&local_3d8) {
                    operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p != paVar2) {
                    operator_delete(local_510._M_dataplus._M_p,
                                    local_510.field_2._M_allocated_capacity + 1);
                  }
                  if (local_4e8 != &local_4d8) {
                    operator_delete(local_4e8,local_4d8 + 1);
                  }
                  if (depthErrorImage.m_format != TVar26) {
                    operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
                  }
                  if (stencilErrorImage.m_format !=
                      (TextureFormat)(stencilErrorImage.m_size.m_data + 2)) {
                    operator_delete((void *)stencilErrorImage.m_format,stencilErrorImage._16_8_ + 1)
                    ;
                  }
                  local_4c0 = (pointer)((ulong)local_4c0 & 0xffffffff00000000);
                }
              }
            }
            else {
              tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                        (&depthAccess_1,&format_7,targetSize->m_data[0],targetSize->m_data[1],1,
                         pvVar12);
              depthAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
              depthAccess.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
              tcu::TextureLevel::TextureLevel
                        ((TextureLevel *)&stencilAccess_1,(TextureFormat *)&depthAccess,
                         targetSize->m_data[0],targetSize->m_data[1],1);
              paVar2 = &local_510.field_2;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
              TVar26 = (TextureFormat)(depthErrorImage.m_size.m_data + 2);
              std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
              std::ios_base::~ios_base(local_1c8);
              pTVar31 = (TextureFormat *)
                        std::__cxx11::string::replace
                                  ((ulong)&stencilErrorImage,0,(char *)0x0,0xaab8fd);
              TVar40 = (TextureFormat)(pTVar31 + 2);
              if (*pTVar31 == TVar40) {
                depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
                depthErrorImage.m_format = TVar26;
              }
              else {
                depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                depthErrorImage.m_format = *pTVar31;
              }
              depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
              *pTVar31 = TVar40;
              pTVar31[1].order = R;
              pTVar31[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar31[2].order = R;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
              std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_4e8,0,(char *)0x0,0xa99e38);
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510.field_2._8_8_ = plVar30[3];
                local_510._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_510._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              pCVar43 = &depthAccess_1;
              tcu::LogImage::LogImage
                        ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)&format,iVar59,__buf_05,(size_t)pCVar43);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_p != local_3b8) {
                operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
              }
              if (format != (TextureFormat)&local_3d8) {
                operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != paVar2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
              if (local_4e8 != &local_4d8) {
                operator_delete(local_4e8,local_4d8 + 1);
              }
              if (depthErrorImage.m_format != TVar26) {
                operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
              }
              if (stencilErrorImage.m_format != (TextureFormat)(stencilErrorImage.m_size.m_data + 2)
                 ) {
                operator_delete((void *)stencilErrorImage.m_format,stencilErrorImage._16_8_ + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
              std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
              std::ios_base::~ios_base(local_1c8);
              pTVar31 = (TextureFormat *)
                        std::__cxx11::string::replace
                                  ((ulong)&stencilErrorImage,0,(char *)0x0,0xa9a30e);
              TVar40 = (TextureFormat)(pTVar31 + 2);
              if (*pTVar31 == TVar40) {
                depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
                depthErrorImage.m_format = TVar26;
              }
              else {
                depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                depthErrorImage.m_format = *pTVar31;
              }
              depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
              *pTVar31 = TVar40;
              pTVar31[1].order = R;
              pTVar31[1].type = SNORM_INT8;
              *(undefined1 *)&pTVar31[2].order = R;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
              std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
              std::ios_base::~ios_base(local_1c8);
              plVar30 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_4e8,0,(char *)0x0,0xa9a322);
              psVar41 = (size_type *)(plVar30 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar30 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510.field_2._8_8_ = plVar30[3];
                local_510._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_510.field_2._M_allocated_capacity = *psVar41;
                local_510._M_dataplus._M_p = (pointer)*plVar30;
              }
              local_510._M_string_length = plVar30[1];
              *plVar30 = (long)psVar41;
              plVar30[1] = 0;
              *(undefined1 *)(plVar30 + 2) = 0;
              pCVar43 = &depthAccess.super_ConstPixelBufferAccess;
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)pCVar43,
                         referenceAttachments.
                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar69);
              tcu::LogImage::LogImage
                        ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                         QP_IMAGE_COMPRESSION_MODE_BEST);
              tcu::LogImage::write((LogImage *)&format,iVar59,__buf_07,(size_t)pCVar43);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_p != local_3b8) {
                operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
              }
              if (format != (TextureFormat)&local_3d8) {
                operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_510._M_dataplus._M_p != paVar2) {
                operator_delete(local_510._M_dataplus._M_p,
                                local_510.field_2._M_allocated_capacity + 1);
              }
              if (local_4e8 != &local_4d8) {
                operator_delete(local_4e8,local_4d8 + 1);
              }
              if (depthErrorImage.m_format != TVar26) {
                operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
              }
              if (stencilErrorImage.m_format != (TextureFormat)(stencilErrorImage.m_size.m_data + 2)
                 ) {
                operator_delete((void *)stencilErrorImage.m_format,stencilErrorImage._16_8_ + 1);
              }
              pAVar29 = (pRVar51->m_attachments).
                        super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((*(int *)((long)&pAVar29->m_storeOp + local_4f0) == 0) ||
                 (*(int *)((long)&pAVar29->m_stencilStoreOp + local_4f0) == 0)) {
                pvVar25 = referenceValues.
                          super__Vector_base<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar69;
                tcu::TextureLevel::getAccess(&depthAccess,(TextureLevel *)&stencilAccess_1);
                TStack_3e0 = (TextureFormat)0x3f80000000000000;
                format.order = 0x3f800000;
                format.type = SNORM_INT8;
                depthErrorImage.m_format.order = R;
                depthErrorImage.m_format.type = 0x3f800000;
                depthErrorImage.m_size.m_data[0] = 0;
                depthErrorImage.m_size.m_data[1] = 0x3f800000;
                pRVar51 = local_4c8;
                if (0 < depthAccess_1.m_size.m_data[1]) {
                  iVar23 = 0;
                  bVar19 = true;
                  iVar76 = depthAccess_1.m_size.m_data[1];
                  iVar79 = depthAccess_1.m_size.m_data[0];
                  do {
                    if (0 < iVar79) {
                      iVar53 = 0;
LAB_003a9f43:
                      tcu::ConstPixelBufferAccess::getPixel
                                ((ConstPixelBufferAccess *)&stencilErrorImage,(int)&depthAccess_1,
                                 iVar53,iVar23);
                      uVar22 = (pvVar25->
                               super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                               )._M_impl.super__Vector_impl_data._M_start
                               [depthAccess_1.m_size.m_data[0] * iVar23 + iVar53].m_status;
                      bVar20 = true;
                      lVar61 = 0;
LAB_003a9f7a:
                      lVar70 = lVar61 + 1;
                      uVar73 = (int)lVar61 * 2;
                      do {
                        if ((uVar22 >> (uVar73 & 0x1f) & 1) != 0) {
                          fVar75 = *(float *)((long)(&stencilErrorImage.m_size + -1) + lVar70 * 4);
                          if ((uVar22 >> ((byte)uVar73 & 0x1f) & 2) == 0) {
                            bVar71 = fVar75 == 0.0;
                          }
                          else {
                            bVar71 = fVar75 == 1.0;
                          }
                          if ((!bVar71) || (NAN(fVar75))) goto LAB_003a9fbf;
                        }
                        lVar70 = lVar70 + 1;
                        uVar73 = uVar73 + 2;
                        if (lVar70 == 5) {
                          pTVar58 = (TextureLevel *)&format;
                          if (bVar20) {
                            pTVar58 = &depthErrorImage;
                          }
                          bVar19 = (bool)(bVar19 & bVar20);
                          goto LAB_003a9fea;
                        }
                      } while( true );
                    }
LAB_003aa01f:
                    pRVar51 = local_4c8;
                    iVar23 = iVar23 + 1;
                  } while (iVar23 < iVar76);
                  if (!bVar19) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
                    std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
                    std::ios_base::~ios_base(local_1c8);
                    pTVar31 = (TextureFormat *)
                              std::__cxx11::string::replace
                                        ((ulong)&stencilErrorImage,0,(char *)0x0,0xa9a33d);
                    TVar40 = (TextureFormat)(pTVar31 + 2);
                    if (*pTVar31 == TVar40) {
                      depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                      depthErrorImage.m_data.m_ptr = *(void **)(pTVar31 + 3);
                      depthErrorImage.m_format = TVar26;
                    }
                    else {
                      depthErrorImage._16_8_ = *(undefined8 *)TVar40;
                      depthErrorImage.m_format = *pTVar31;
                    }
                    depthErrorImage.m_size.m_data._0_8_ = pTVar31[1];
                    *pTVar31 = TVar40;
                    pTVar31[1].order = R;
                    pTVar31[1].type = SNORM_INT8;
                    *(undefined1 *)&pTVar31[2].order = R;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&depthAccess);
                    std::ostream::_M_insert<unsigned_long>((ulong)&depthAccess);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depthAccess);
                    std::ios_base::~ios_base(local_1c8);
                    plVar30 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_4e8,0,(char *)0x0,0xa9a353);
                    psVar41 = (size_type *)(plVar30 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar30 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar41) {
                      local_510.field_2._M_allocated_capacity = *psVar41;
                      local_510.field_2._8_8_ = plVar30[3];
                      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
                    }
                    else {
                      local_510.field_2._M_allocated_capacity = *psVar41;
                      local_510._M_dataplus._M_p = (pointer)*plVar30;
                    }
                    local_510._M_string_length = plVar30[1];
                    *plVar30 = (long)psVar41;
                    plVar30[1] = 0;
                    *(undefined1 *)(plVar30 + 2) = 0;
                    pCVar43 = &depthAccess.super_ConstPixelBufferAccess;
                    tcu::TextureLevel::getAccess
                              ((PixelBufferAccess *)pCVar43,(TextureLevel *)&stencilAccess_1);
                    tcu::LogImage::LogImage
                              ((LogImage *)&format,(string *)&depthErrorImage,&local_510,pCVar43,
                               QP_IMAGE_COMPRESSION_MODE_BEST);
                    tcu::LogImage::write((LogImage *)&format,iVar59,__buf_12,(size_t)pCVar43);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c8._M_p != local_3b8) {
                      operator_delete(local_3c8._M_p,local_3b8[0]._M_allocated_capacity + 1);
                    }
                    if (format != (TextureFormat)&local_3d8) {
                      operator_delete((void *)format,local_3d8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_510._M_dataplus._M_p != &local_510.field_2) {
                      operator_delete(local_510._M_dataplus._M_p,
                                      local_510.field_2._M_allocated_capacity + 1);
                    }
                    if (local_4e8 != &local_4d8) {
                      operator_delete(local_4e8,local_4d8 + 1);
                    }
                    if (depthErrorImage.m_format != TVar26) {
                      operator_delete((void *)depthErrorImage.m_format,depthErrorImage._16_8_ + 1);
                    }
                    if (stencilErrorImage.m_format !=
                        (TextureFormat)(stencilErrorImage.m_size.m_data + 2)) {
                      operator_delete((void *)stencilErrorImage.m_format,
                                      stencilErrorImage._16_8_ + 1);
                    }
                    local_4c0 = (pointer)((ulong)local_4c0 & 0xffffffff00000000);
                  }
                }
              }
            }
          }
          tcu::TextureLevel::~TextureLevel((TextureLevel *)&stencilAccess_1);
        }
LAB_003aa960:
        uVar69 = uVar69 + 1;
        pAVar29 = (pRVar51->m_attachments).
                  super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar69 < (ulong)((long)(pRVar51->m_attachments).
                                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar29 >>
                               5));
    }
  }
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector(&referenceAttachments)
  ;
  std::
  vector<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>,_std::allocator<std::vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>_>_>
  ::~vector(&referenceValues);
  return (bool)((byte)local_4c0 & 1);
LAB_003a9fbf:
  bVar20 = false;
  lVar61 = lVar70;
  if (lVar70 == 4) goto code_r0x003a9fc7;
  goto LAB_003a9f7a;
code_r0x003a9fc7:
  pTVar58 = (TextureLevel *)&format;
  bVar19 = false;
LAB_003a9fea:
  tcu::PixelBufferAccess::setPixel(&depthAccess,(Vec4 *)pTVar58,iVar53,iVar23,0);
  iVar53 = iVar53 + 1;
  iVar76 = depthAccess_1.m_size.m_data[1];
  iVar79 = depthAccess_1.m_size.m_data[0];
  if (depthAccess_1.m_size.m_data[0] <= iVar53) goto LAB_003aa01f;
  goto LAB_003a9f43;
}

Assistant:

bool logAndVerifyImages (TestLog&											log,
						 const DeviceInterface&								vk,
						 VkDevice											device,
						 const vector<de::SharedPtr<AttachmentResources> >&	attachmentResources,
						 const vector<bool>&								attachmentIsLazy,
						 const RenderPass&									renderPassInfo,
						 const vector<Maybe<VkClearValue> >&				renderPassClearValues,
						 const vector<Maybe<VkClearValue> >&				imageClearValues,
						 const vector<SubpassRenderInfo>&					subpassRenderInfo,
						 const UVec2&										targetSize,
						 const TestConfig&									config)
{
	vector<vector<PixelValue> >	referenceValues;
	vector<tcu::TextureLevel>	referenceAttachments;
	bool						isOk					= true;

	log << TestLog::Message << "Reference images fill undefined pixels with 3x3 grid pattern." << TestLog::EndMessage;

	renderReferenceValues(referenceValues, renderPassInfo, targetSize, imageClearValues, renderPassClearValues, subpassRenderInfo, config.renderPos, config.renderSize);
	renderReferenceImagesFromValues(referenceAttachments, referenceValues, targetSize, renderPassInfo);

	for (size_t attachmentNdx = 0; attachmentNdx < renderPassInfo.getAttachments().size(); attachmentNdx++)
	{
		if (!attachmentIsLazy[attachmentNdx])
		{
			const Attachment			attachment		= renderPassInfo.getAttachments()[attachmentNdx];
			const tcu::TextureFormat	format			= mapVkFormat(attachment.getFormat());

			if (tcu::hasDepthComponent(format.order) && tcu::hasStencilComponent(format.order))
			{
				const tcu::TextureFormat	depthFormat			= getDepthCopyFormat(attachment.getFormat());
				const VkDeviceSize			depthBufferSize		= targetSize.x() * targetSize.y() * depthFormat.getPixelSize();
				void* const					depthPtr			= attachmentResources[attachmentNdx]->getResultMemory().getHostPtr();

				const tcu::TextureFormat	stencilFormat		= getStencilCopyFormat(attachment.getFormat());
				const VkDeviceSize			stencilBufferSize	= targetSize.x() * targetSize.y() * stencilFormat.getPixelSize();
				void* const					stencilPtr			= attachmentResources[attachmentNdx]->getSecondaryResultMemory().getHostPtr();

				const VkMappedMemoryRange	ranges[]			=
				{
					{
						VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,								// sType;
						DE_NULL,															// pNext;
						attachmentResources[attachmentNdx]->getResultMemory().getMemory(),	// mem;
						attachmentResources[attachmentNdx]->getResultMemory().getOffset(),	// offset;
						depthBufferSize														// size;
					},
					{
						VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,										// sType;
						DE_NULL,																	// pNext;
						attachmentResources[attachmentNdx]->getSecondaryResultMemory().getMemory(),	// mem;
						attachmentResources[attachmentNdx]->getSecondaryResultMemory().getOffset(),	// offset;
						stencilBufferSize															// size;
					}
				};
				VK_CHECK(vk.invalidateMappedMemoryRanges(device, 2u, ranges));

				{
					const ConstPixelBufferAccess	depthAccess			(depthFormat, targetSize.x(), targetSize.y(), 1, depthPtr);
					const ConstPixelBufferAccess	stencilAccess		(stencilFormat, targetSize.x(), targetSize.y(), 1, stencilPtr);
					tcu::TextureLevel				depthErrorImage		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());
					tcu::TextureLevel				stencilErrorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx) + "Depth", "Attachment " + de::toString(attachmentNdx) + " Depth", depthAccess);
					log << TestLog::Image("Attachment" + de::toString(attachmentNdx) + "Stencil", "Attachment " + de::toString(attachmentNdx) + " Stencil", stencilAccess);

					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if (renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE
						&& !verifyDepthAttachment(referenceValues[attachmentNdx], depthAccess, depthErrorImage.getAccess()))
					{
						log << TestLog::Image("DepthAttachmentError" + de::toString(attachmentNdx), "Depth Attachment Error " + de::toString(attachmentNdx), depthErrorImage.getAccess());
						isOk = false;
					}

					if (renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE
						&& !verifyStencilAttachment(referenceValues[attachmentNdx], stencilAccess, stencilErrorImage.getAccess()))
					{
						log << TestLog::Image("StencilAttachmentError" + de::toString(attachmentNdx), "Stencil Attachment Error " + de::toString(attachmentNdx), stencilErrorImage.getAccess());
						isOk = false;
					}
				}
			}
			else
			{
				const VkDeviceSize			bufferSize	= targetSize.x() * targetSize.y() * format.getPixelSize();
				void* const					ptr			= attachmentResources[attachmentNdx]->getResultMemory().getHostPtr();

				const VkMappedMemoryRange	range		=
				{
					VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,								// sType;
					DE_NULL,															// pNext;
					attachmentResources[attachmentNdx]->getResultMemory().getMemory(),	// mem;
					attachmentResources[attachmentNdx]->getResultMemory().getOffset(),	// offset;
					bufferSize															// size;
				};
				VK_CHECK(vk.invalidateMappedMemoryRanges(device, 1u, &range));

				if (tcu::hasDepthComponent(format.order))
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyDepthAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
				else if (tcu::hasStencilComponent(format.order))
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyStencilAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
				else
				{
					const ConstPixelBufferAccess	access		(format, targetSize.x(), targetSize.y(), 1, ptr);
					tcu::TextureLevel				errorImage	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), targetSize.x(), targetSize.y());

					log << TestLog::Image("Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx), access);
					log << TestLog::Image("AttachmentReference" + de::toString(attachmentNdx), "Attachment reference " + de::toString(attachmentNdx), referenceAttachments[attachmentNdx].getAccess());

					if ((renderPassInfo.getAttachments()[attachmentNdx].getStoreOp() == VK_ATTACHMENT_STORE_OP_STORE || renderPassInfo.getAttachments()[attachmentNdx].getStencilStoreOp() == VK_ATTACHMENT_STORE_OP_STORE)
						&& !verifyColorAttachment(referenceValues[attachmentNdx], access, errorImage.getAccess()))
					{
						log << TestLog::Image("AttachmentError" + de::toString(attachmentNdx), "Attachment Error " + de::toString(attachmentNdx), errorImage.getAccess());
						isOk = false;
					}
				}
			}
		}
	}

	return isOk;
}